

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void fmt::v9::detail::vformat_to<char>
               (buffer<char> *buf,text_style *ts,basic_string_view<char> format_str,
               basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args)

{
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_string_view<char> fmt;
  emphasis em;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  locale_ref local_d8;
  unsigned_long_long local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_c8;
  char *local_c0;
  size_t local_b8;
  color_type local_ac;
  undefined1 local_a4 [8];
  ansi_color_escape<char> background;
  undefined1 local_79 [8];
  ansi_color_escape<char> foreground;
  ansi_color_escape<char> emphasis;
  bool has_style;
  text_style *ts_local;
  buffer<char> *buf_local;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_local;
  basic_string_view<char> format_str_local;
  
  emphasis.buffer[0x18] = text_style::has_emphasis(ts);
  if ((bool)emphasis.buffer[0x18]) {
    em = text_style::get_emphasis(ts);
    make_emphasis<char>((ansi_color_escape<char> *)(foreground.buffer + 0x18),em);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)(foreground.buffer + 0x18));
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)(foreground.buffer + 0x18));
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  bVar1 = text_style::has_foreground(ts);
  if (bVar1) {
    emphasis.buffer[0x18] = '\x01';
    background.buffer._24_8_ = text_style::get_foreground(ts);
    make_foreground_color<char>
              ((ansi_color_escape<char> *)local_79,(color_type)background.buffer._24_8_);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)local_79);
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)local_79);
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  bVar1 = text_style::has_background(ts);
  if (bVar1) {
    emphasis.buffer[0x18] = '\x01';
    local_ac = text_style::get_background(ts);
    make_background_color<char>((ansi_color_escape<char> *)local_a4,local_ac);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)local_a4);
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)local_a4);
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  local_d0 = args.desc_;
  local_c8 = args.field_1;
  local_c0 = format_str.data_;
  local_b8 = format_str.size_;
  locale_ref::locale_ref(&local_d8);
  fmt.size_ = local_b8;
  fmt.data_ = local_c0;
  args_00.field_1.args_ = local_c8.args_;
  args_00.desc_ = local_d0;
  vformat_to<char>(buf,fmt,args_00,local_d8);
  if (emphasis.buffer[0x18] != '\0') {
    reset_color<char>(buf);
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, const text_style& ts,
                basic_string_view<Char> format_str,
                basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    auto emphasis = detail::make_emphasis<Char>(ts.get_emphasis());
    buf.append(emphasis.begin(), emphasis.end());
  }
  if (ts.has_foreground()) {
    has_style = true;
    auto foreground = detail::make_foreground_color<Char>(ts.get_foreground());
    buf.append(foreground.begin(), foreground.end());
  }
  if (ts.has_background()) {
    has_style = true;
    auto background = detail::make_background_color<Char>(ts.get_background());
    buf.append(background.begin(), background.end());
  }
  detail::vformat_to(buf, format_str, args, {});
  if (has_style) detail::reset_color<Char>(buf);
}